

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pparsefp.h
# Opt level: O1

char * parse_double(char *buf,size_t len,double *result)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  long lVar6;
  byte *pbVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  byte *pbVar12;
  byte *pbVar13;
  int iVar14;
  int iVar15;
  byte *pbVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  bool bVar26;
  double dVar27;
  grisu3_diy_fp_t n;
  grisu3_diy_fp_t gVar28;
  byte *local_38;
  
  *result = 0.0;
  lVar6 = len + 1;
  if (1000 < len) {
    lVar6 = 0x3e9;
  }
  if (lVar6 == 0) {
    return buf;
  }
  cVar1 = *buf;
  pcVar11 = buf;
  if (cVar1 == '-') {
    if (lVar6 == 1) {
      return (char *)0x0;
    }
    pcVar11 = buf + 1;
  }
  pbVar7 = (byte *)(buf + lVar6);
  cVar2 = *pcVar11;
  if (cVar2 == '0') {
    pbVar12 = (byte *)(pcVar11 + 1);
    if (pbVar12 != pbVar7) {
      if ((*pbVar12 & 0xdf) == 0x58) {
        *result = 0.0;
        return buf;
      }
      if (pbVar12 != pbVar7) {
        uVar19 = 0;
        do {
          if (*pbVar12 != 0x30) break;
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 != pbVar7);
        goto LAB_001098ae;
      }
    }
    uVar19 = 0;
  }
  else {
    if ((byte)(cVar2 - 0x3aU) < 0xf7) {
      if (cVar1 == '-') {
        return (char *)0x0;
      }
      return buf;
    }
    pbVar12 = (byte *)(pcVar11 + 1);
    uVar19 = (ulong)(byte)(cVar2 - 0x30);
  }
LAB_001098ae:
  uVar24 = 0;
  for (pbVar16 = pbVar12; pbVar16 != pbVar7; pbVar16 = pbVar16 + 1) {
    bVar8 = *pbVar16 - 0x30;
    if (9 < bVar8) break;
    if (0x1999999999999998 < uVar19) {
      uVar19 = uVar19 + ('4' < (char)*pbVar16);
      iVar25 = 1;
      goto LAB_00109906;
    }
    uVar19 = (ulong)bVar8 + uVar19 * 10;
  }
  iVar25 = 0;
LAB_00109906:
  pbVar13 = pbVar16;
  if (pbVar16 != pbVar7) {
    uVar24 = 0;
    do {
      if (pbVar16[uVar24] != 0x30) {
        if ((byte)(pbVar16[uVar24] - 0x31) < 9) goto LAB_00109940;
        break;
      }
      lVar6 = uVar24 + 1;
      uVar24 = uVar24 + 1;
    } while (pbVar16 + lVar6 != pbVar7);
    pbVar13 = pbVar16 + uVar24;
  }
  goto LAB_0010996c;
  while ((byte)(*pbVar13 - 0x30) < 10) {
LAB_00109a07:
    pbVar13 = pbVar13 + 1;
    iVar25 = 1;
    if (pbVar13 == pbVar7) break;
  }
  goto LAB_00109a32;
  while ((byte)(*pbVar13 - 0x30) < 10) {
LAB_00109940:
    uVar24 = uVar24 + 1;
    pbVar13 = pbVar16 + uVar24;
    if (pbVar13 == pbVar7) break;
  }
  iVar25 = 1;
LAB_0010996c:
  iVar10 = (int)uVar24;
  iVar14 = (int)pbVar16 - (int)pbVar12;
  if ((pbVar13 != pbVar7) && (*pbVar13 == 0x2e)) {
    if ((byte)(pbVar13[1] - 0x3a) < 0xf6) {
      return (char *)0x0;
    }
    pbVar12 = pbVar13 + 1;
    pbVar13 = pbVar12;
    if (pbVar12 != pbVar7) {
      while( true ) {
        bVar8 = *pbVar13 - 0x30;
        if (9 < bVar8) break;
        if (0x1999999999999998 < uVar19) {
          bVar26 = iVar25 == 0;
          iVar25 = 1;
          if (bVar26) {
            uVar19 = uVar19 + ('4' < (char)*pbVar13);
          }
          break;
        }
        pbVar13 = pbVar13 + 1;
        uVar19 = (ulong)bVar8 + uVar19 * 10;
        uVar24 = (ulong)((int)uVar24 - 1);
        if (pbVar13 == pbVar7) break;
      }
    }
    iVar14 = ((int)pbVar13 - (int)pbVar12) + iVar14;
    for (; iVar10 = (int)uVar24, pbVar13 != pbVar7; pbVar13 = pbVar13 + 1) {
      if (*pbVar13 != 0x30) {
        if ((byte)(*pbVar13 - 0x31) < 9) goto LAB_00109a07;
        break;
      }
      uVar24 = (ulong)(iVar10 + 1);
    }
  }
LAB_00109a32:
  bVar26 = false;
  if ((pbVar13 == pbVar7) || ((*pbVar13 & 0xdf) != 0x45)) {
    uVar9 = 0;
  }
  else {
    bVar26 = false;
    if ((long)pbVar7 - (long)pbVar13 < 2) {
      return (char *)0x0;
    }
    if (pbVar13[1] == 0x2d) {
      bVar26 = true;
LAB_00109d32:
      pbVar13 = pbVar13 + 2;
      if (pbVar13 == pbVar7) {
        return (char *)0x0;
      }
    }
    else {
      if (pbVar13[1] == 0x2b) {
        bVar26 = false;
        goto LAB_00109d32;
      }
      pbVar13 = pbVar13 + 1;
    }
    if ((byte)(*pbVar13 - 0x3a) < 0xf6) {
      return (char *)0x0;
    }
    uVar9 = (uint)(byte)(*pbVar13 - 0x30);
    while ((pbVar13 = pbVar13 + 1, pbVar13 != pbVar7 && ((byte)(*pbVar13 - 0x30) < 10))) {
      if ((int)uVar9 < 0x8000) {
        uVar9 = (*pbVar13 - 0x30) + uVar9 * 10;
      }
    }
  }
  if (pbVar13 == pbVar7) {
    return (char *)0x0;
  }
  uVar23 = -uVar9;
  if (!bVar26) {
    uVar23 = uVar9;
  }
  dVar27 = 0.0;
  if ((uVar19 != 0) && (uVar23 = iVar10 + iVar14 + uVar23, -0x145 < (int)uVar23)) {
    if ((int)uVar23 < 0x137) {
      if ((uVar19 >> 0x35 != 0) || (0x16 < uVar23)) {
        uVar23 = uVar23 - iVar14;
        gVar28._8_8_ = 0;
        gVar28.f = uVar19;
        gVar28 = grisu3_diy_fp_normalize(gVar28);
        auVar4 = gVar28._0_12_;
        iVar25 = (iVar25 << 2) << (-(char)gVar28.e & 0x1fU);
        if ((int)uVar23 < -0x15c) {
          __assert_fail("-348 <= d_exp",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                        ,0x4f,"int grisu3_diy_fp_cached_dec_pow(int, grisu3_diy_fp_t *)");
        }
        if (0x15b < (int)uVar23) {
          __assert_fail("d_exp < 340 + d_exp_dist",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                        ,0x50,"int grisu3_diy_fp_cached_dec_pow(int, grisu3_diy_fp_t *)");
        }
        uVar9 = uVar23 + 0x15c >> 3;
        uVar18 = (uint)grisu3_diy_fp_pow_cache[uVar9].d_exp;
        if ((int)uVar23 < (int)uVar18) {
          __assert_fail("a_exp <= d_exp",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                        ,0x57,"int grisu3_diy_fp_cached_dec_pow(int, grisu3_diy_fp_t *)");
        }
        if ((int)(uVar18 + 8) <= (int)uVar23) {
          __assert_fail("d_exp < a_exp + d_exp_dist",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                        ,0x58,"int grisu3_diy_fp_cached_dec_pow(int, grisu3_diy_fp_t *)");
        }
        iVar10 = iVar25;
        if (uVar23 != uVar18) {
          uVar23 = uVar23 + ~uVar18;
          if (6 < uVar23) {
            __assert_fail("adj_exp >= 0 && adj_exp < 7",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                          ,0xb8,"int grisu3_diy_fp_encode_double(uint64_t, int, int, int, double *)"
                         );
          }
          uVar19 = gVar28.f >> 0x20;
          uVar20 = *(ulong *)(grisu3_diy_fp_encode_double_cp_10_lut + (ulong)uVar23 * 0x10) &
                   0xffffffff;
          uVar21 = *(ulong *)(grisu3_diy_fp_encode_double_cp_10_lut + (ulong)uVar23 * 0x10) >> 0x20;
          uVar22 = uVar21 * (uint)gVar28.f;
          uVar24 = uVar19 * uVar20;
          auVar4._8_4_ = gVar28.e +
                         *(int *)(grisu3_diy_fp_encode_double_cp_10_lut + (ulong)uVar23 * 0x10 + 8)
                         + 0x40;
          auVar4._0_8_ = ((uVar22 & 0xffffffff) +
                          (uVar24 & 0xffffffff) + (uVar20 * (uint)gVar28.f >> 0x20) + 0x80000000 >>
                         0x20) + (uVar22 >> 0x20) + (uVar24 >> 0x20) + uVar21 * uVar19;
          iVar10 = iVar25 + 4;
          if ((int)(iVar14 + 1 + uVar23) < 0x14) {
            iVar10 = iVar25;
          }
        }
        uVar22 = auVar4._0_8_ >> 0x20;
        uVar19 = grisu3_diy_fp_pow_cache[uVar9].fract >> 0x20;
        uVar21 = grisu3_diy_fp_pow_cache[uVar9].fract & 0xffffffff;
        uVar24 = uVar19 * auVar4._0_4_;
        uVar20 = uVar22 * uVar21;
        n.f = ((uVar24 & 0xffffffff) + (uVar20 & 0xffffffff) + (auVar4._0_4_ * uVar21 >> 0x20) +
               0x80000000 >> 0x20) + (uVar24 >> 0x20) + (uVar20 >> 0x20) + uVar22 * uVar19;
        iVar15 = (int)grisu3_diy_fp_pow_cache[uVar9].b_exp + auVar4._8_4_ + 0x40;
        n.e = iVar15;
        n._12_4_ = 0;
        gVar28 = grisu3_diy_fp_normalize(n);
        auVar5 = gVar28._0_12_;
        iVar25 = gVar28.e;
        iVar14 = 0x40;
        if (-0x472 < iVar25) {
          iVar14 = -(iVar25 + 0x432);
        }
        iVar17 = 0;
        if (iVar25 < -0x432) {
          iVar17 = iVar14;
        }
        iVar14 = (9 - (uint)(iVar10 == 0)) + iVar10 << ((char)iVar15 - (char)gVar28.e & 0x1fU);
        if (0x3c < iVar17) {
          bVar8 = (char)iVar17 - 0x3e;
          auVar5._8_4_ = iVar25 + iVar17 + -0x3e;
          auVar5._0_8_ = gVar28.f >> (bVar8 & 0x3f);
          iVar14 = (iVar14 >> (bVar8 & 0x1f)) + 9;
          iVar17 = 0x3e;
        }
        uVar19 = auVar5._0_8_ >> ((byte)iVar17 & 0x3f);
        iVar25 = auVar5._8_4_ + iVar17;
        uVar9 = (uint)(1L << ((byte)iVar17 - 1 & 0x3f));
        iVar10 = iVar14 + uVar9 * 8;
        if ((iVar10 <= iVar17) && (uVar19 = uVar19 + 1, (uVar19 & 0x20000000000000) != 0)) {
          uVar19 = uVar19 >> 1;
          iVar25 = iVar25 + 1;
        }
        uVar24 = uVar19;
        if (0x1fffffffffffff < uVar19) {
          do {
            uVar19 = uVar24 >> 1;
            iVar25 = iVar25 + 1;
            uVar21 = uVar24 >> 0x36;
            uVar24 = uVar19;
          } while (uVar21 != 0);
        }
        if (iVar25 < -0x432) {
          dVar27 = 0.0;
        }
        else {
          uVar21 = uVar19 & 0x10000000000000;
          bVar26 = uVar21 == 0;
          uVar24 = uVar19;
          iVar15 = iVar25;
          if (iVar25 != -0x432) {
            do {
              uVar19 = uVar24;
              iVar25 = iVar15;
              if (uVar21 != 0) break;
              uVar19 = uVar24 * 2;
              iVar25 = iVar15 + -1;
              uVar21 = uVar24 & 0x8000000000000;
              bVar26 = uVar21 == 0;
              bVar3 = -0x431 < iVar15;
              uVar24 = uVar19;
              iVar15 = iVar25;
            } while (bVar3);
          }
          uVar21 = (ulong)(iVar25 + 0x433) << 0x34;
          uVar24 = 0;
          if (!bVar26) {
            uVar24 = uVar21;
          }
          if (iVar25 != -0x432) {
            uVar24 = uVar21;
          }
          dVar27 = (double)(uVar19 & 0xfffffffffffff | uVar24);
        }
        iVar25 = (uVar9 & auVar5._0_4_) * 8;
        *result = dVar27;
        if (((int)(uVar9 * 8 - iVar14) < iVar25) && (iVar25 < iVar10)) {
          dVar27 = strtod(buf,(char **)&local_38);
          *result = dVar27;
          if (local_38 < pbVar13) {
            return (char *)local_38;
          }
          return (char *)pbVar13;
        }
        goto LAB_00109abb;
      }
      dVar27 = (double)(long)uVar19;
      switch(uVar23 - iVar14) {
      case 1:
        dVar27 = dVar27 * 10.0;
        break;
      case 2:
        dVar27 = dVar27 * 100.0;
        break;
      case 3:
        dVar27 = dVar27 * 1000.0;
        break;
      case 4:
        dVar27 = dVar27 * 10000.0;
        break;
      case 5:
        dVar27 = dVar27 * 100000.0;
        break;
      case 6:
        dVar27 = dVar27 * 1000000.0;
        break;
      case 7:
        dVar27 = dVar27 * 10000000.0;
        break;
      case 8:
        dVar27 = dVar27 * 100000000.0;
        break;
      case 9:
        dVar27 = dVar27 * 1000000000.0;
        break;
      case 10:
        dVar27 = dVar27 * 10000000000.0;
        break;
      case 0xb:
        dVar27 = dVar27 * 100000000000.0;
        break;
      case 0xc:
        dVar27 = dVar27 * 1000000000000.0;
        break;
      case 0xd:
        dVar27 = dVar27 * 10000000000000.0;
        break;
      case 0xe:
        dVar27 = dVar27 * 100000000000000.0;
        break;
      case 0xf:
        dVar27 = dVar27 * 1e+15;
        break;
      case 0x10:
        dVar27 = dVar27 * 1e+16;
        break;
      case 0x11:
        dVar27 = dVar27 * 1e+17;
        break;
      case 0x12:
        dVar27 = dVar27 * 1e+18;
        break;
      case 0x13:
        dVar27 = dVar27 * 1e+19;
        break;
      case 0x14:
        dVar27 = dVar27 * 1e+20;
        break;
      case 0x15:
        dVar27 = dVar27 * 1e+21;
        break;
      case 0x16:
        dVar27 = dVar27 * 1e+22;
        break;
      case 0xffffffea:
        dVar27 = dVar27 / 1e+22;
        break;
      case 0xffffffeb:
        dVar27 = dVar27 / 1e+21;
        break;
      case 0xffffffec:
        dVar27 = dVar27 / 1e+20;
        break;
      case 0xffffffed:
        dVar27 = dVar27 / 1e+19;
        break;
      case 0xffffffee:
        dVar27 = dVar27 / 1e+18;
        break;
      case 0xffffffef:
        dVar27 = dVar27 / 1e+17;
        break;
      case 0xfffffff0:
        dVar27 = dVar27 / 1e+16;
        break;
      case 0xfffffff1:
        dVar27 = dVar27 / 1e+15;
        break;
      case 0xfffffff2:
        dVar27 = dVar27 / 100000000000000.0;
        break;
      case 0xfffffff3:
        dVar27 = dVar27 / 10000000000000.0;
        break;
      case 0xfffffff4:
        dVar27 = dVar27 / 1000000000000.0;
        break;
      case 0xfffffff5:
        dVar27 = dVar27 / 100000000000.0;
        break;
      case 0xfffffff6:
        dVar27 = dVar27 / 10000000000.0;
        break;
      case 0xfffffff7:
        dVar27 = dVar27 / 1000000000.0;
        break;
      case 0xfffffff8:
        dVar27 = dVar27 / 100000000.0;
        break;
      case 0xfffffff9:
        dVar27 = dVar27 / 10000000.0;
        break;
      case 0xfffffffa:
        dVar27 = dVar27 / 1000000.0;
        break;
      case 0xfffffffb:
        dVar27 = dVar27 / 100000.0;
        break;
      case 0xfffffffc:
        dVar27 = dVar27 / 10000.0;
        break;
      case 0xfffffffd:
        dVar27 = dVar27 / 1000.0;
        break;
      case 0xfffffffe:
        dVar27 = dVar27 / 100.0;
        break;
      case 0xffffffff:
        dVar27 = dVar27 / 10.0;
      }
    }
    else {
      dVar27 = INFINITY;
    }
  }
  *result = dVar27;
LAB_00109abb:
  if (cVar1 == '-') {
    *result = -*result;
    return (char *)pbVar13;
  }
  return (char *)pbVar13;
}

Assistant:

static inline const char *parse_double(const char *buf, size_t len, double *result)
{
    return grisu3_parse_double(buf, len, result);
}